

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O1

int lookup(node *table,char *key)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = hash(key,0x1e);
  if (table == (node *)0x0) {
    uVar1 = 0;
  }
  else {
    iVar2 = strcmp(table[uVar1].key,key);
    uVar1 = (uint)(iVar2 != 0);
  }
  return uVar1;
}

Assistant:

int lookup(node *table, const char *key)
{
    unsigned index = hash(key, TABLESIZE);
    const node *it = &table[index];

    if(it == NULL){
        return 0;
    }
    if(strcmp(it->key, key)){
        return 1;
    }
    // Попытка установить наличие соответствующего ключа в связанном списке
    /*
    while(it != NULL && strcmp(it->key, key) != 0)
    {
        it = it->next;
    }*/
    return 0;
}